

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_3U>::iterator::recomputeBounds
          (iterator *this,uint32_t level)

{
  pointer pEVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  ulong *puVar7;
  ulong uVar8;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *self;
  undefined8 *puVar9;
  ulong uVar10;
  
  if (level != 0) {
    pEVar1 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar2 = (ulong)level;
    do {
      uVar3 = uVar2 - 1;
      uVar4 = (ulong)pEVar1[uVar3].offset;
      if (uVar3 == 0) {
        puVar7 = (ulong *)((long)pEVar1->node + uVar4 * 8);
        puVar5 = (undefined8 *)((long)pEVar1->node + uVar4 * 0x10 + 0x10);
      }
      else {
        puVar7 = (ulong *)((long)pEVar1[uVar3].node + uVar4 * 8);
        puVar5 = (undefined8 *)((long)pEVar1[uVar3].node + uVar4 * 0x10 + 0x40);
      }
      uVar4 = *puVar7;
      puVar9 = (undefined8 *)(uVar4 & 0xffffffffffffffc0);
      if (uVar2 == (int)(this->super_const_iterator).path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1) {
        uVar6 = *puVar9;
        uVar2 = puVar9[1];
        if ((uVar4 & 0x3f) != 0) {
          uVar10 = 0;
          uVar8 = uVar2;
          do {
            uVar2 = *(ulong *)((long)puVar9 + uVar10 + 0x18);
            if (uVar2 < uVar8) {
              uVar2 = uVar8;
            }
            uVar10 = uVar10 + 0x10;
            uVar8 = uVar2;
          } while (((uint)uVar4 & 0x3f) << 4 != uVar10);
        }
      }
      else {
        uVar6 = puVar9[8];
        uVar2 = puVar9[9];
        if ((uVar4 & 0x3f) != 0) {
          uVar10 = 0;
          uVar8 = uVar2;
          do {
            uVar2 = *(ulong *)((long)puVar9 + uVar10 + 0x58);
            if (uVar2 < uVar8) {
              uVar2 = uVar8;
            }
            uVar10 = uVar10 + 0x10;
            uVar8 = uVar2;
          } while (((uint)uVar4 & 0x3f) << 4 != uVar10);
        }
      }
      *puVar5 = uVar6;
      puVar5[1] = uVar2;
      uVar2 = uVar3;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::recomputeBounds(uint32_t level) {
    using namespace IntervalMapDetails;

    auto& path = this->path;
    while (level) {
        --level;
        auto offset = path.offset(level);
        interval<TKey>* key;
        NodeRef child;

        if (level == 0) {
            auto& branch = path.template node<RootBranch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }
        else {
            auto& branch = path.template node<Branch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }

        auto bounds = (level == path.height() - 1)
                          ? child.template get<Leaf>().getBounds(child.size())
                          : child.template get<Branch>().getBounds(child.size());
        *key = bounds;
    }
}